

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_fma::create_pipeline_int8_x86(Convolution_x86_fma *this,Option *opt)

{
  Mat *pMVar1;
  float fVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  uint uVar15;
  _func_int *p_Var16;
  size_t sVar17;
  Allocator *pAVar18;
  _func_int **pp_Var19;
  int *piVar20;
  size_t sVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  uint num_input;
  int iVar25;
  long lVar26;
  void *pvVar27;
  ulong uVar28;
  ulong uVar29;
  void *pvVar30;
  ulong uVar31;
  void *pvVar32;
  byte bVar33;
  int j;
  uint uVar34;
  undefined4 uVar35;
  void *pvVar36;
  int q_1;
  ulong uVar37;
  void *pvVar38;
  uint uVar39;
  void *pvVar40;
  void *pvVar41;
  int k;
  void *pvVar42;
  void *pvVar43;
  int i_1;
  int iVar44;
  int iVar45;
  long lVar46;
  uint *puVar47;
  undefined2 *puVar48;
  int i_2;
  long lVar49;
  void *pvVar50;
  void *pvVar51;
  void *pvVar52;
  long lVar53;
  int p;
  ulong uVar54;
  void *pvVar55;
  int q;
  Mat *pMVar56;
  undefined2 *puVar57;
  undefined2 *puVar58;
  int p_1;
  long lVar59;
  undefined2 *puVar60;
  bool bVar61;
  byte bVar62;
  float fVar63;
  undefined8 local_c0;
  undefined1 local_b8 [64];
  size_t local_78;
  long local_68;
  uint local_60;
  undefined4 local_5c;
  short sStack_58;
  uint auStack_56 [9];
  
  p_Var16 = this->_vptr_Convolution_x86_fma[-3];
  iVar25 = *(int *)(p_Var16 + 0x34 + (long)&(this->weight_winograd23_data).data);
  iVar44 = *(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data);
  uVar28 = (long)*(int *)(p_Var16 + 0x1c + (long)&(this->weight_winograd43_data).data) /
           (long)(iVar44 * iVar25);
  uVar15 = *(uint *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
  uVar28 = (long)((ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) /
           (long)(int)uVar15;
  num_input = (uint)uVar28;
  uVar54 = uVar28 & 0xffffffff;
  bVar33 = opt->use_packing_layout;
  local_c0 = (void *)(long)(int)num_input;
  if ((bool)bVar33 != true) {
    bVar61 = false;
    goto LAB_001f24ba;
  }
  bVar61 = (uVar28 & 7) == 0;
  uVar39 = uVar15 & 3;
  bVar62 = uVar39 != 0;
  uVar34 = num_input & 7;
  if ((uVar28 & 7) == 0 && uVar39 == 0) {
    if (((iVar44 == 1 && iVar25 == 1) &&
        (*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
          (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
         ((*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2 &&
          (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 2)))))))) {
      iVar25 = 1;
      iVar44 = iVar25;
LAB_001f2498:
      convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse
                ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,uVar15,iVar25,iVar44);
    }
    else if ((((opt->use_winograd_convolution == true) &&
              (((iVar44 == 3 && (iVar25 == 3)) && (opt->use_winograd43_convolution != false)))) &&
             (((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
            (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 1)) {
      pMVar56 = (Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data);
      pMVar1 = &this->weight_winograd43_data;
      local_60 = uVar39;
      local_5c = num_input & 7;
      iVar25 = cpu_support_x86_avx2();
      if (iVar25 == 0) {
        iVar25 = cpu_support_x86_xop();
        if (iVar25 == 0) {
          local_78 = 0;
          local_b8._0_8_ = (void *)0x0;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          local_b8._16_8_ = 0;
          local_b8._24_4_ = 0;
          local_b8._32_8_ = (Allocator *)0x0;
          local_b8._40_4_ = 0;
          local_b8._44_4_ = 0;
          local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
          uVar29 = 0;
          Mat::create((Mat *)local_b8,0x24,num_input,uVar15,2,(Allocator *)0x0);
          uVar37 = 0;
          if (0 < (int)num_input) {
            uVar37 = uVar28 & 0xffffffff;
          }
          uVar28 = 0;
          if (0 < (int)uVar15) {
            uVar28 = (ulong)uVar15;
          }
          for (; uVar29 != uVar28; uVar29 = uVar29 + 1) {
            iVar25 = num_input * 9 * (int)uVar29;
            pvVar27 = pMVar56->data;
            pvVar52 = (void *)(local_b8._16_8_ * local_78 * uVar29 + local_b8._0_8_);
            for (uVar31 = 0; uVar31 != uVar37; uVar31 = uVar31 + 1) {
              lVar59 = uVar31 * 9;
              cVar3 = *(char *)((long)pvVar27 + lVar59 + iVar25);
              cVar4 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 1);
              cVar5 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 2);
              cVar6 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 3);
              cVar7 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 4);
              cVar8 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 5);
              cVar9 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 6);
              cVar10 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 7);
              cVar11 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 8);
              for (lVar59 = 4; lVar59 != 0x28; lVar59 = lVar59 + 6) {
                sVar12 = *(short *)(&UNK_004c718c + lVar59);
                sVar13 = *(short *)(&UNK_004c718e + lVar59);
                sVar14 = *(short *)((long)&DAT_004c7190 + lVar59);
                *(short *)((long)&local_5c + lVar59) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_5c + lVar59 + 2) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)((long)auStack_56 + lVar59 + -2) =
                     sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar30 = pvVar52;
              for (lVar59 = 0; lVar59 != 6; lVar59 = lVar59 + 1) {
                sVar12 = *(short *)((long)auStack_56 + lVar59 * 6 + -2);
                uVar34 = *(uint *)((long)auStack_56 + lVar59 * 6);
                puVar47 = &DAT_004c7192;
                for (lVar26 = 0; lVar26 != 6; lVar26 = lVar26 + 1) {
                  auVar22 = vpmullw_avx(ZEXT416(*puVar47),ZEXT416(uVar34));
                  uVar35 = vpextrw_avx(auVar22,1);
                  *(short *)((long)pvVar30 + lVar26 * 2) =
                       (short)uVar35 + auVar22._0_2_ + *(short *)((long)puVar47 + -2) * sVar12;
                  puVar47 = (uint *)((long)puVar47 + 6);
                }
                pvVar30 = (void *)((long)pvVar30 + 0xc);
              }
              pvVar52 = (void *)((long)pvVar52 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
            }
          }
          Mat::create(pMVar1,(int)((long)((ulong)(uint)((int)num_input >> 0x1f) << 0x20 | uVar54) /
                                  8),0x24,(int)uVar15 / 4,0x40,0x20,(Allocator *)0x0);
          lVar26 = local_78 * local_b8._16_8_;
          iVar25 = (this->weight_winograd43_data).w;
          pvVar52 = (this->weight_winograd43_data).data;
          sVar17 = (this->weight_winograd43_data).elemsize;
          sVar21 = (this->weight_winograd43_data).cstep;
          pvVar42 = (void *)(lVar26 * 3 + local_b8._0_8_);
          local_68 = lVar26 * 4;
          lVar59 = (long)(int)local_b8._44_4_ * local_b8._16_8_ * 8;
          pvVar27 = (void *)(local_b8._0_8_ + lVar26 * 2);
          pvVar50 = (void *)(lVar26 + local_b8._0_8_);
          pvVar30 = (void *)local_b8._0_8_;
          for (uVar28 = 0; (long)(uVar28 | 3) < (long)(int)uVar15; uVar28 = uVar28 + 4) {
            pvVar32 = pvVar30;
            pvVar41 = pvVar42;
            pvVar43 = pvVar50;
            pvVar51 = pvVar27;
            for (lVar26 = 0; lVar26 != 0x24; lVar26 = lVar26 + 1) {
              lVar46 = (long)pvVar52 +
                       (long)iVar25 * sVar17 * lVar26 + (uVar28 >> 2) * sVar21 * sVar17;
              pvVar36 = pvVar32;
              pvVar38 = pvVar43;
              pvVar40 = pvVar41;
              pvVar55 = pvVar51;
              for (uVar37 = 0; (long)(uVar37 | 7) < (long)local_c0; uVar37 = uVar37 + 8) {
                lVar49 = 0;
                for (lVar53 = 0; lVar53 != 0x40; lVar53 = lVar53 + 8) {
                  *(undefined2 *)(lVar46 + lVar53) = *(undefined2 *)((long)pvVar36 + lVar49);
                  *(undefined2 *)(lVar46 + lVar53 + 2) = *(undefined2 *)((long)pvVar38 + lVar49);
                  *(undefined2 *)(lVar46 + lVar53 + 4) = *(undefined2 *)((long)pvVar55 + lVar49);
                  *(undefined2 *)(lVar46 + lVar53 + 6) = *(undefined2 *)((long)pvVar40 + lVar49);
                  lVar49 = lVar49 + (long)(int)local_b8._44_4_ * local_b8._16_8_;
                }
                pvVar40 = (void *)((long)pvVar40 + lVar59);
                pvVar55 = (void *)((long)pvVar55 + lVar59);
                pvVar38 = (void *)((long)pvVar38 + lVar59);
                pvVar36 = (void *)((long)pvVar36 + lVar59);
                lVar46 = lVar46 + 0x40;
              }
              pvVar41 = (void *)((long)pvVar41 + 2);
              pvVar51 = (void *)((long)pvVar51 + 2);
              pvVar43 = (void *)((long)pvVar43 + 2);
              pvVar32 = (void *)((long)pvVar32 + 2);
            }
            pvVar42 = (void *)((long)pvVar42 + local_68);
            pvVar27 = (void *)((long)pvVar27 + local_68);
            pvVar50 = (void *)((long)pvVar50 + local_68);
            pvVar30 = (void *)((long)pvVar30 + local_68);
          }
          piVar20 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
          uVar34 = local_5c;
          uVar39 = local_60;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
                free((void *)local_b8._0_8_);
                uVar34 = local_5c;
                uVar39 = local_60;
              }
              else {
                (*(*(_func_int ***)local_b8._32_8_)[3])();
                uVar34 = local_5c;
                uVar39 = local_60;
              }
            }
          }
          goto LAB_001f22a4;
        }
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
                  (pMVar56,pMVar1,num_input,uVar15,opt);
      }
      else {
        conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_avx2
                  (pMVar56,pMVar1,num_input,uVar15,opt);
      }
    }
    else {
      if (opt->use_sgemm_convolution == true) goto LAB_001f2498;
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,uVar15,iVar25,iVar44,8,4);
    }
LAB_001f24ba:
    bVar62 = bVar33 ^ 1;
  }
  else {
LAB_001f22a4:
    bVar33 = bVar61;
    if ((uVar39 == 0) && (uVar34 != 0)) {
      p_Var16 = this->_vptr_Convolution_x86_fma[-3];
      iVar25 = *(int *)(p_Var16 + 0x34 + (long)&(this->weight_winograd23_data).data);
      if (iVar25 == 7) {
        if ((((*(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data) != 7) ||
             (*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1)) ||
            (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
           ((*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2 ||
            (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) != 2))))
        goto LAB_001f2af6;
        iVar44 = *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar25 = 7;
        iVar45 = iVar25;
      }
      else if (iVar25 == 3) {
        if ((*(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data) != 3) ||
           ((((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) != 1 ||
              (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) != 1)))) &&
            ((((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) != 1 ||
               (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) != 2)) ||
             (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) != 2))))))
        goto LAB_001f2af6;
        iVar44 = *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar25 = 3;
        iVar45 = iVar25;
      }
      else if (((iVar25 == 1) &&
               (*(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
              ((((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                 ((*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
                (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 1)) ||
               ((((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
                  (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
                 (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
                (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
        iVar44 = *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar25 = 1;
        iVar45 = iVar25;
      }
      else {
LAB_001f2af6:
        iVar44 = *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
        iVar45 = *(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data);
        if (opt->use_sgemm_convolution != true) {
          convolution_transform_kernel_packed_int8_sse
                    ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
                     &this->weight_data_tm,num_input,iVar44,iVar25,iVar45,1,4);
          goto LAB_001f2bad;
        }
      }
      convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse
                ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,iVar44,iVar25,iVar45);
      goto LAB_001f2bad;
    }
  }
  if ((bVar62 != 0) && (bVar61)) {
    p_Var16 = this->_vptr_Convolution_x86_fma[-3];
    iVar25 = *(int *)(p_Var16 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if (((iVar25 == 1) &&
        (*(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
         (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 1)) ||
        ((((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data),1,1);
    }
    else if ((((opt->use_winograd_convolution == true) && (iVar25 == 3)) &&
             ((opt->use_winograd43_convolution != false &&
              ((*(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
               (*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)))))) &&
            ((*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
             ((*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 1)))))) {
      pMVar1 = &this->weight_winograd43_data;
      uVar15 = *(uint *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
      pMVar56 = (Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data);
      iVar25 = cpu_support_x86_avx2();
      if (iVar25 == 0) {
        iVar25 = cpu_support_x86_xop();
        if (iVar25 == 0) {
          local_78 = 0;
          local_b8._0_8_ = (void *)0x0;
          local_b8._8_4_ = 0;
          local_b8._12_4_ = 0;
          local_b8._16_8_ = 0;
          local_b8._24_4_ = 0;
          local_b8._32_8_ = (Allocator *)0x0;
          local_b8._40_4_ = 0;
          local_b8._44_4_ = 0;
          local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
          uVar37 = 0;
          Mat::create((Mat *)local_b8,0x24,num_input,uVar15,2,(Allocator *)0x0);
          uVar28 = 0;
          if (0 < (int)num_input) {
            uVar28 = uVar54;
          }
          uVar29 = 0;
          if (0 < (int)uVar15) {
            uVar29 = (ulong)uVar15;
          }
          for (; uVar37 != uVar29; uVar37 = uVar37 + 1) {
            iVar25 = num_input * 9 * (int)uVar37;
            pvVar27 = pMVar56->data;
            pvVar52 = (void *)(local_b8._16_8_ * local_78 * uVar37 + local_b8._0_8_);
            for (uVar31 = 0; uVar31 != uVar28; uVar31 = uVar31 + 1) {
              lVar59 = uVar31 * 9;
              cVar3 = *(char *)((long)pvVar27 + lVar59 + iVar25);
              cVar4 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 1);
              cVar5 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 2);
              cVar6 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 3);
              cVar7 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 4);
              cVar8 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 5);
              cVar9 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 6);
              cVar10 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 7);
              cVar11 = *(char *)((long)pvVar27 + lVar59 + (long)iVar25 + 8);
              for (lVar59 = 4; lVar59 != 0x28; lVar59 = lVar59 + 6) {
                sVar12 = *(short *)(&UNK_004c718c + lVar59);
                sVar13 = *(short *)(&UNK_004c718e + lVar59);
                sVar14 = *(short *)((long)&DAT_004c7190 + lVar59);
                *(short *)((long)&local_5c + lVar59) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_5c + lVar59 + 2) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)((long)auStack_56 + lVar59 + -2) =
                     sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar30 = pvVar52;
              for (lVar59 = 0; lVar59 != 6; lVar59 = lVar59 + 1) {
                sVar12 = *(short *)((long)auStack_56 + lVar59 * 6 + -2);
                uVar34 = *(uint *)((long)auStack_56 + lVar59 * 6);
                puVar47 = &DAT_004c7192;
                for (lVar26 = 0; lVar26 != 6; lVar26 = lVar26 + 1) {
                  auVar22 = vpmullw_avx(ZEXT416(*puVar47),ZEXT416(uVar34));
                  uVar35 = vpextrw_avx(auVar22,1);
                  *(short *)((long)pvVar30 + lVar26 * 2) =
                       (short)uVar35 + auVar22._0_2_ + *(short *)((long)puVar47 + -2) * sVar12;
                  puVar47 = (uint *)((long)puVar47 + 6);
                }
                pvVar30 = (void *)((long)pvVar30 + 0xc);
              }
              pvVar52 = (void *)((long)pvVar52 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
            }
          }
          Mat::create(pMVar1,num_input,0x24,((int)uVar15 / 4) * -3 + uVar15,8,4,(Allocator *)0x0);
          lVar26 = local_78 * local_b8._16_8_;
          iVar25 = (this->weight_winograd43_data).w;
          pvVar52 = (this->weight_winograd43_data).data;
          sVar17 = (this->weight_winograd43_data).elemsize;
          sVar21 = (this->weight_winograd43_data).cstep;
          pvVar50 = (void *)(lVar26 * 3 + local_b8._0_8_);
          local_68 = lVar26 * 4;
          lVar59 = (long)(int)local_b8._44_4_ * local_b8._16_8_ * 8;
          pvVar27 = (void *)(local_b8._0_8_ + lVar26 * 2);
          pvVar42 = (void *)(lVar26 + local_b8._0_8_);
          pvVar30 = (void *)local_b8._0_8_;
          for (uVar28 = 0; (long)(uVar28 | 3) < (long)(int)uVar15; uVar28 = uVar28 + 4) {
            pvVar32 = pvVar42;
            pvVar41 = pvVar30;
            pvVar43 = pvVar27;
            pvVar51 = pvVar50;
            for (lVar26 = 0; lVar26 != 0x24; lVar26 = lVar26 + 1) {
              lVar46 = (long)pvVar52 +
                       (long)iVar25 * sVar17 * lVar26 + (uVar28 >> 2) * sVar21 * sVar17;
              pvVar36 = pvVar41;
              pvVar38 = pvVar51;
              pvVar40 = pvVar32;
              pvVar55 = pvVar43;
              for (uVar37 = 0; (long)(uVar37 | 7) < (long)local_c0; uVar37 = uVar37 + 8) {
                lVar49 = 0;
                for (lVar53 = 0; lVar53 != 0x40; lVar53 = lVar53 + 8) {
                  *(undefined2 *)(lVar46 + lVar53) = *(undefined2 *)((long)pvVar36 + lVar49);
                  *(undefined2 *)(lVar46 + lVar53 + 2) = *(undefined2 *)((long)pvVar40 + lVar49);
                  *(undefined2 *)(lVar46 + lVar53 + 4) = *(undefined2 *)((long)pvVar55 + lVar49);
                  *(undefined2 *)(lVar46 + lVar53 + 6) = *(undefined2 *)((long)pvVar38 + lVar49);
                  lVar49 = lVar49 + (long)(int)local_b8._44_4_ * local_b8._16_8_;
                }
                pvVar38 = (void *)((long)pvVar38 + lVar59);
                pvVar55 = (void *)((long)pvVar55 + lVar59);
                pvVar40 = (void *)((long)pvVar40 + lVar59);
                pvVar36 = (void *)((long)pvVar36 + lVar59);
                lVar46 = lVar46 + 0x40;
              }
              pvVar51 = (void *)((long)pvVar51 + 2);
              pvVar43 = (void *)((long)pvVar43 + 2);
              pvVar32 = (void *)((long)pvVar32 + 2);
              pvVar41 = (void *)((long)pvVar41 + 2);
            }
            pvVar50 = (void *)((long)pvVar50 + local_68);
            pvVar27 = (void *)((long)pvVar27 + local_68);
            pvVar42 = (void *)((long)pvVar42 + local_68);
            pvVar30 = (void *)((long)pvVar30 + local_68);
          }
          iVar25 = (this->weight_winograd43_data).w;
          pvVar27 = (this->weight_winograd43_data).data;
          sVar17 = (this->weight_winograd43_data).elemsize;
          sVar21 = (this->weight_winograd43_data).cstep;
          puVar48 = (undefined2 *)(local_b8._16_8_ * local_78 * uVar28 + local_b8._0_8_);
          for (; (long)uVar28 < (long)(int)uVar15; uVar28 = uVar28 + 1) {
            puVar60 = puVar48;
            for (lVar59 = 0; lVar59 != 0x24; lVar59 = lVar59 + 1) {
              lVar26 = (long)pvVar27 +
                       (long)iVar25 * sVar17 * lVar59 +
                       (ulong)(((uint)uVar28 & 3) + ((uint)(uVar28 >> 2) & 0x3fffffff)) *
                       sVar21 * sVar17;
              puVar57 = puVar60;
              for (uVar37 = 0; (long)(uVar37 | 7) < (long)local_c0; uVar37 = uVar37 + 8) {
                puVar58 = puVar57;
                for (lVar46 = 0; lVar46 != 0x10; lVar46 = lVar46 + 2) {
                  *(undefined2 *)(lVar26 + lVar46) = *puVar58;
                  puVar58 = (undefined2 *)
                            ((long)puVar58 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
                }
                puVar57 = puVar57 + (long)(int)local_b8._44_4_ * local_b8._16_8_ * 4;
                lVar26 = lVar26 + 0x10;
              }
              puVar60 = puVar60 + 1;
            }
            puVar48 = (undefined2 *)((long)puVar48 + local_b8._16_8_ * local_78);
          }
          piVar20 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
                free((void *)local_b8._0_8_);
              }
              else {
                (*(*(_func_int ***)local_b8._32_8_)[3])();
              }
            }
          }
        }
        else {
          conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
                    (pMVar56,pMVar1,num_input,uVar15,opt);
        }
      }
      else {
        conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
                  (pMVar56,pMVar1,num_input,uVar15,opt);
      }
    }
    else if (opt->use_sgemm_convolution == true) {
      convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse
                ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_sgemm_data,num_input,
                 *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data),iVar25,
                 *(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data));
    }
    else {
      convolution_transform_kernel_packed_int8_sse
                ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
                 &this->weight_data_tm,num_input,
                 *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data),iVar25,
                 *(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data),8,1);
    }
  }
  if ((bVar62 & (bVar33 ^ 1)) == 1) {
    p_Var16 = this->_vptr_Convolution_x86_fma[-3];
    iVar25 = *(int *)(p_Var16 + 0x34 + (long)&(this->weight_winograd23_data).data);
    if (((iVar25 == 1) &&
        (*(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data) == 1)) &&
       (((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
         (((*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 1)))) ||
        ((((*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1 &&
           (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)) &&
          (*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 2)) &&
         (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 2)))))) {
      iVar45 = *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar44 = 1;
      iVar25 = iVar44;
    }
    else {
      if ((((opt->use_winograd_convolution == true) && (iVar25 == 3)) &&
          (((opt->use_winograd23_convolution != false &&
            (((*(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data) == 3 &&
              (*(int *)(p_Var16 + 0x3c + (long)&(this->weight_winograd23_data).data) == 1)) &&
             (*(int *)(p_Var16 + 0x40 + (long)&(this->weight_winograd23_data).data) == 1)))) &&
           ((*(int *)(p_Var16 + 0x44 + (long)&(this->weight_winograd23_data).data) == 1 &&
            (*(int *)(p_Var16 + (long)&(this->weight_winograd43_data).data) == 1)))))) &&
         (0xf < (int)num_input)) {
        iVar44 = *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
        if (0xf < (long)iVar44) {
          Mat::create(&this->weight_winograd23_data,0x10,num_input,iVar44,2,(Allocator *)0x0);
          for (lVar59 = 0; lVar59 != iVar44; lVar59 = lVar59 + 1) {
            lVar26 = (long)(int)(num_input * 9 * (int)lVar59) +
                     *(long *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data);
            iVar25 = (this->weight_winograd23_data).w;
            sVar17 = (this->weight_winograd23_data).elemsize;
            pvVar27 = (void *)(sVar17 * (this->weight_winograd23_data).cstep * lVar59 +
                              (long)(this->weight_winograd23_data).data);
            for (uVar28 = 0; pvVar52 = pvVar27, uVar28 != uVar54; uVar28 = uVar28 + 1) {
              lVar46 = uVar28 * 9;
              cVar3 = *(char *)(lVar26 + lVar46);
              cVar4 = *(char *)(lVar26 + 1 + lVar46);
              cVar5 = *(char *)(lVar26 + 2 + lVar46);
              cVar6 = *(char *)(lVar26 + 3 + lVar46);
              cVar7 = *(char *)(lVar26 + 4 + lVar46);
              cVar8 = *(char *)(lVar26 + 5 + lVar46);
              cVar9 = *(char *)(lVar26 + 6 + lVar46);
              cVar10 = *(char *)(lVar26 + 7 + lVar46);
              cVar11 = *(char *)(lVar26 + 8 + lVar46);
              for (lVar46 = 4; lVar46 != 0x1c; lVar46 = lVar46 + 6) {
                sVar12 = *(short *)(&UNK_004c71bc + lVar46);
                sVar13 = *(short *)(&UNK_004c71be + lVar46);
                sVar14 = *(short *)((long)&DAT_004c71c0 + lVar46);
                *(short *)((long)&local_c0 + lVar46 + 4) =
                     sVar14 * cVar5 + sVar13 * cVar4 + sVar12 * cVar3;
                *(short *)((long)&local_c0 + lVar46 + 6) =
                     sVar14 * cVar8 + sVar13 * cVar7 + sVar12 * cVar6;
                *(short *)(local_b8 + lVar46) = sVar14 * cVar11 + sVar13 * cVar10 + sVar12 * cVar9;
              }
              pvVar27 = pvVar52;
              for (lVar46 = 0; lVar46 != 4; lVar46 = lVar46 + 1) {
                sVar12 = *(short *)(local_b8 + lVar46 * 6);
                uVar15 = *(uint *)(local_b8 + lVar46 * 6 + 2);
                puVar47 = &DAT_004c71c2;
                for (lVar49 = 0; lVar49 != 4; lVar49 = lVar49 + 1) {
                  auVar22 = vpmullw_avx(ZEXT416(*puVar47),ZEXT416(uVar15));
                  uVar35 = vpextrw_avx(auVar22,1);
                  *(short *)((long)pvVar27 + lVar49 * 2) =
                       (short)uVar35 + auVar22._0_2_ + *(short *)((long)puVar47 + -2) * sVar12;
                  puVar47 = (uint *)((long)puVar47 + 6);
                }
                pvVar27 = (void *)((long)pvVar27 + 8);
              }
              pvVar27 = (void *)((long)pvVar52 + (long)iVar25 * sVar17);
              local_c0 = pvVar52;
            }
          }
          goto LAB_001f2bad;
        }
      }
      if (opt->use_sgemm_convolution != true) {
        if (p_Var16 != (_func_int *)0xfffffffffffffeb0) {
          piVar20 = *(int **)(p_Var16 + 0x38 + (long)&(this->weight_winograd63_data).data);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
          }
          piVar20 = (this->weight_data_tm).refcount;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              pAVar18 = (this->weight_data_tm).allocator;
              if (pAVar18 == (Allocator *)0x0) {
                free((this->weight_data_tm).data);
              }
              else {
                (*pAVar18->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined1 (*) [16])((long)&(this->weight_data_tm).refcount + 4) = (undefined1  [16])0x0
          ;
          (this->weight_data_tm).data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).c = 0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          piVar20 = *(int **)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data + 8);
          (this->weight_data_tm).data =
               *(void **)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).refcount = piVar20;
          (this->weight_data_tm).elemsize =
               *(size_t *)(p_Var16 + 0x40 + (long)&(this->weight_winograd63_data).data);
          (this->weight_data_tm).elempack =
               *(int *)((long)&this->convolution_dilation1 + (long)p_Var16);
          (this->weight_data_tm).allocator =
               *(Allocator **)(p_Var16 + (long)&(this->scale_in_data).data);
          uVar23 = *(undefined8 *)(p_Var16 + 8 + (long)&(this->scale_in_data).data);
          uVar24 = *(undefined8 *)(p_Var16 + 8 + (long)&(this->scale_in_data).data + 8);
          (this->weight_data_tm).dims = (int)uVar23;
          (this->weight_data_tm).w = (int)((ulong)uVar23 >> 0x20);
          (this->weight_data_tm).h = (int)uVar24;
          (this->weight_data_tm).d = (int)((ulong)uVar24 >> 0x20);
          (this->weight_data_tm).c = *(int *)(p_Var16 + 0x18 + (long)&(this->scale_in_data).data);
          (this->weight_data_tm).cstep =
               *(size_t *)(p_Var16 + 0x20 + (long)&(this->scale_in_data).data);
        }
        goto LAB_001f2bad;
      }
      iVar45 = *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
      iVar44 = *(int *)(p_Var16 + 0x38 + (long)&(this->weight_winograd23_data).data);
    }
    convolution_im2col_sgemm_transform_kernel_int8_sse
              ((Mat *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data),
               &this->weight_sgemm_data,num_input,iVar45,iVar25,iVar44);
  }
LAB_001f2bad:
  Mat::create(&this->scale_in_data,
              *(int *)(this->_vptr_Convolution_x86_fma[-3] + 0x30 +
                      (long)&(this->weight_winograd23_data).data),4,(Allocator *)0x0);
  pp_Var19 = this->_vptr_Convolution_x86_fma;
  pvVar27 = (this->scale_in_data).data;
  for (lVar59 = 0; p_Var16 = pp_Var19[-3],
      lVar59 < *(int *)(p_Var16 + 0x30 + (long)&(this->weight_winograd23_data).data);
      lVar59 = lVar59 + 1) {
    fVar2 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var16) + lVar59 * 4);
    fVar63 = 0.0;
    if (fVar2 != 0.0) {
      fVar63 = 1.0 / (fVar2 * **(float **)(&this->field_0x238 + (long)p_Var16));
    }
    *(float *)((long)pvVar27 + lVar59 * 4) = fVar63;
  }
  if (opt->lightmode != false) {
    piVar20 = *(int **)(p_Var16 + 0x38 + (long)&(this->weight_winograd63_data).data);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (*(long **)(p_Var16 + (long)&(this->scale_in_data).data) == (long *)0x0) {
          free(*(void **)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data));
        }
        else {
          (**(code **)(**(long **)(p_Var16 + (long)&(this->scale_in_data).data) + 0x18))();
        }
      }
    }
    *(undefined8 *)(p_Var16 + 0x20 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var16 + 0x3c + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var16 + 0x44 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var16 + 0x30 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var16 + 0x38 + (long)&(this->weight_winograd63_data).data) = 0;
    *(undefined8 *)(p_Var16 + 8 + (long)&(this->scale_in_data).data) = 0;
    *(undefined8 *)(p_Var16 + 0x10 + (long)&(this->scale_in_data).data) = 0;
    *(undefined4 *)(p_Var16 + 0x18 + (long)&(this->scale_in_data).data) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_fma::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = num_input % 8 == 0 ? 8 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_int8_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            // conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_int8_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}